

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O2

void golf_gi_start(golf_gi_t *gi)

{
  _Bool _Var1;
  golf_thread_t pvVar2;
  
  _Var1 = golf_gi_is_running(gi);
  if (_Var1) {
    golf_log_error("Cannot start gi when it\'s already running.");
  }
  _gi_set_is_running(gi,true);
  pvVar2 = golf_thread_create(_gi_run,gi,"gi");
  gi->thread = pvVar2;
  return;
}

Assistant:

void golf_gi_start(golf_gi_t *gi) {
    if (golf_gi_is_running(gi)) {
        golf_log_error("Cannot start gi when it's already running.");
    }

    _gi_set_is_running(gi, true);
    gi->thread = golf_thread_create(_gi_run, gi, "gi");
}